

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypedArray.cpp
# Opt level: O0

void __thiscall
Js::TypedArrayBase::SetObjectNoDetachCheck
          (TypedArrayBase *this,RecyclableObject *source,uint32 targetLength,uint32 offset)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  undefined4 *puVar4;
  JavascriptLibrary *this_00;
  RecyclableObject *pRVar5;
  uint local_44;
  uint32 i;
  Var undefinedValue;
  Var itemValue;
  ScriptContext *pSStack_28;
  uint32 sourceLength;
  ScriptContext *scriptContext;
  uint32 offset_local;
  uint32 targetLength_local;
  RecyclableObject *source_local;
  TypedArrayBase *this_local;
  
  scriptContext._0_4_ = offset;
  scriptContext._4_4_ = targetLength;
  _offset_local = source;
  source_local = (RecyclableObject *)this;
  pSStack_28 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
  itemValue._4_4_ = GetSourceLength(this,_offset_local,scriptContext._4_4_,(uint32)scriptContext);
  bVar2 = IsDetachedBuffer(this);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/TypedArray.cpp"
                                ,0x3a1,"(!this->IsDetachedBuffer())","!this->IsDetachedBuffer()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  this_00 = ScriptContext::GetLibrary(pSStack_28);
  pRVar5 = JavascriptLibraryBase::GetUndefined(&this_00->super_JavascriptLibraryBase);
  for (local_44 = 0; local_44 < itemValue._4_4_; local_44 = local_44 + 1) {
    BVar3 = RecyclableObject::GetItem
                      (_offset_local,_offset_local,local_44,&undefinedValue,pSStack_28);
    if (BVar3 == 0) {
      undefinedValue = pRVar5;
    }
    (*(this->super_ArrayBufferParent).super_ArrayObject.super_DynamicObject.super_RecyclableObject.
      super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x73])
              (this,(ulong)((uint32)scriptContext + local_44),undefinedValue);
  }
  bVar2 = IsDetachedBuffer(this);
  if (bVar2) {
    Throw::FatalInternalError(-0x7fffbffb);
  }
  return;
}

Assistant:

void TypedArrayBase::SetObjectNoDetachCheck(RecyclableObject* source, uint32 targetLength, uint32 offset)
    {
        ScriptContext* scriptContext = GetScriptContext();
        uint32 sourceLength = GetSourceLength(source, targetLength, offset);
        Assert(!this->IsDetachedBuffer());

        Var itemValue;
        Var undefinedValue = scriptContext->GetLibrary()->GetUndefined();
        for (uint32 i = 0; i < sourceLength; i++)
        {
            if (!source->GetItem(source, i, &itemValue, scriptContext))
            {
                itemValue = undefinedValue;
            }
            DirectSetItemNoDetachCheck(offset + i, itemValue);
        }

        if (this->IsDetachedBuffer())
        {
            // We cannot be detached when we are creating the typed array itself. Terminate if that happens.
            Throw::FatalInternalError();
        }
    }